

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void init_simple_motion_search_mvs(SIMPLE_MOTION_DATA_TREE *sms_tree,FULLPEL_MV *start_mvs)

{
  PARTITION_TYPE PVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  SIMPLE_MOTION_DATA_TREE *in_RSI;
  byte *in_RDI;
  FULLPEL_MV *in_stack_ffffffffffffffe8;
  
  PVar1 = in_RSI->partitioning;
  uVar2 = in_RSI->field_0x2;
  uVar3 = in_RSI->field_0x3;
  uVar4 = in_RSI->field_0x4;
  uVar5 = in_RSI->field_0x5;
  uVar6 = in_RSI->field_0x6;
  uVar7 = in_RSI->field_0x7;
  in_RDI[0x28] = in_RSI->block_size;
  in_RDI[0x29] = PVar1;
  in_RDI[0x2a] = uVar2;
  in_RDI[0x2b] = uVar3;
  in_RDI[0x2c] = uVar4;
  in_RDI[0x2d] = uVar5;
  in_RDI[0x2e] = uVar6;
  in_RDI[0x2f] = uVar7;
  *(SIMPLE_MOTION_DATA_TREE **)(in_RDI + 0x30) = in_RSI->split[0];
  *(SIMPLE_MOTION_DATA_TREE **)(in_RDI + 0x38) = in_RSI->split[1];
  *(SIMPLE_MOTION_DATA_TREE **)(in_RDI + 0x40) = in_RSI->split[2];
  memset(in_RDI + 0x48,0,8);
  memset(in_RDI + 0x50,0,0x20);
  memset(in_RDI + 0x70,0,4);
  memset(in_RDI + 0x74,0,4);
  if (2 < *in_RDI) {
    init_simple_motion_search_mvs(in_RSI,in_stack_ffffffffffffffe8);
    init_simple_motion_search_mvs(in_RSI,in_stack_ffffffffffffffe8);
    init_simple_motion_search_mvs(in_RSI,in_stack_ffffffffffffffe8);
    init_simple_motion_search_mvs(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static inline void init_simple_motion_search_mvs(
    SIMPLE_MOTION_DATA_TREE *sms_tree, const FULLPEL_MV *start_mvs) {
  memcpy(sms_tree->start_mvs, start_mvs, sizeof(sms_tree->start_mvs));
  av1_zero(sms_tree->sms_none_feat);
  av1_zero(sms_tree->sms_rect_feat);
  av1_zero(sms_tree->sms_none_valid);
  av1_zero(sms_tree->sms_rect_valid);

  if (sms_tree->block_size >= BLOCK_8X8) {
    init_simple_motion_search_mvs(sms_tree->split[0], start_mvs);
    init_simple_motion_search_mvs(sms_tree->split[1], start_mvs);
    init_simple_motion_search_mvs(sms_tree->split[2], start_mvs);
    init_simple_motion_search_mvs(sms_tree->split[3], start_mvs);
  }
}